

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O0

void __thiscall
TaprootScriptTree_TreeTestContainBranchHash_Test::TestBody
          (TaprootScriptTree_TreeTestContainBranchHash_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar_1;
  CfdException *except;
  Message local_190;
  string local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  Script local_140;
  undefined1 local_108 [8];
  TaprootScriptTree tree;
  undefined1 local_68 [8];
  string tapscript;
  allocator local_31;
  undefined1 local_30 [8];
  string tree_str;
  TaprootScriptTree_TreeTestContainBranchHash_Test *this_local;
  
  tree_str.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,
             "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac"
             ,(allocator *)
              ((long)&tree.nodes_.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script(&local_140,(string *)local_68);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar.message_);
  cfd::core::TaprootScriptTree::FromString
            ((TaprootScriptTree *)local_108,(string *)local_30,&local_140,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar.message_,kMainnet);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar.message_);
  cfd::core::Script::~Script(&local_140);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_188,(TapBranch *)local_108);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_168,"tree_str","tree.ToString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_188);
  std::__cxx11::string::~string((string *)&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x266,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_108);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(TaprootScriptTree, TreeTestContainBranchHash) {
  std::string tree_str = "{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}";
  std::string tapscript = "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac";

  try {
    auto tree = TaprootScriptTree::FromString(tree_str, Script(tapscript));
    EXPECT_EQ(tree_str, tree.ToString());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}